

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_intervals.h
# Opt level: O0

vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> * __thiscall
Gudhi::Persistence_representations::Persistence_intervals::dominant_intervals
          (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           *__return_storage_ptr__,Persistence_intervals *this,size_t where_to_cut)

{
  double dVar1;
  unsigned_long uVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference pvVar5;
  unsigned_long *puVar6;
  ostream *poVar7;
  pair<unsigned_long,_double> pVar8;
  size_type local_a8;
  unsigned_long local_a0;
  size_t i_1;
  undefined1 local_89;
  pair<unsigned_long,_double> *local_88;
  __normal_iterator<std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
  local_80;
  double local_78;
  pair<unsigned_long,_double> local_70;
  unsigned_long local_60;
  size_t i;
  allocator<std::pair<unsigned_long,_double>_> local_41;
  undefined1 local_40 [8];
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  position_length_vector;
  size_t sStack_20;
  bool dbg;
  size_t where_to_cut_local;
  Persistence_intervals *this_local;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *result;
  
  position_length_vector.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  sStack_20 = where_to_cut;
  where_to_cut_local = (size_t)this;
  this_local = (Persistence_intervals *)__return_storage_ptr__;
  sVar3 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::size
                    (&this->intervals);
  std::allocator<std::pair<unsigned_long,_double>_>::allocator(&local_41);
  std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ::vector((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
            *)local_40,sVar3,&local_41);
  std::allocator<std::pair<unsigned_long,_double>_>::~allocator(&local_41);
  local_60 = 0;
  while( true ) {
    uVar2 = local_60;
    sVar3 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
            size(&this->intervals);
    if (uVar2 == sVar3) break;
    pvVar4 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[](&this->intervals,local_60);
    dVar1 = pvVar4->second;
    pvVar4 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[](&this->intervals,local_60);
    local_78 = dVar1 - pvVar4->first;
    pVar8 = std::make_pair<unsigned_long&,double>(&local_60,&local_78);
    local_70 = pVar8;
    pvVar5 = std::
             vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
             ::operator[]((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                           *)local_40,local_60);
    std::pair<unsigned_long,_double>::operator=(pvVar5,&local_70);
    local_60 = local_60 + 1;
  }
  local_80._M_current =
       (pair<unsigned_long,_double> *)
       std::
       vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
       ::begin((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                *)local_40);
  local_88 = (pair<unsigned_long,_double> *)
             std::
             vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
             ::end((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                    *)local_40);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,bool(*)(std::pair<unsigned_long,double>const&,std::pair<unsigned_long,double>const&)>
            (local_80,(__normal_iterator<std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
                       )local_88,compare);
  local_89 = 0;
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
            (__return_storage_ptr__);
  i_1 = std::
        vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
        ::size((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                *)local_40);
  puVar6 = std::min<unsigned_long>(&stack0xffffffffffffffe0,&i_1);
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::reserve
            (__return_storage_ptr__,*puVar6);
  local_a0 = 0;
  while( true ) {
    uVar2 = local_a0;
    local_a8 = std::
               vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
               ::size((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                       *)local_40);
    puVar6 = std::min<unsigned_long>(&stack0xffffffffffffffe0,&local_a8);
    if (uVar2 == *puVar6) break;
    pvVar5 = std::
             vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
             ::operator[]((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                           *)local_40,local_a0);
    pvVar4 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[](&this->intervals,pvVar5->first);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::push_back
              (__return_storage_ptr__,pvVar4);
    if ((position_length_vector.
         super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
      poVar7 = std::operator<<((ostream *)&std::clog,"Position : ");
      pvVar5 = std::
               vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
               ::operator[]((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                             *)local_40,local_a0);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,pvVar5->first);
      poVar7 = std::operator<<(poVar7," length : ");
      pvVar5 = std::
               vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
               ::operator[]((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                             *)local_40,local_a0);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,pvVar5->second);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    local_a0 = local_a0 + 1;
  }
  local_89 = 1;
  std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ::~vector((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
             *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<double, double> > Persistence_intervals::dominant_intervals(size_t where_to_cut) const {
  bool dbg = false;
  std::vector<std::pair<size_t, double> > position_length_vector(this->intervals.size());
  for (size_t i = 0; i != this->intervals.size(); ++i) {
    position_length_vector[i] = std::make_pair(i, this->intervals[i].second - this->intervals[i].first);
  }

  std::sort(position_length_vector.begin(), position_length_vector.end(), compare);

  std::vector<std::pair<double, double> > result;
  result.reserve(std::min(where_to_cut, position_length_vector.size()));

  for (size_t i = 0; i != std::min(where_to_cut, position_length_vector.size()); ++i) {
    result.push_back(this->intervals[position_length_vector[i].first]);
    if (dbg)
      std::clog << "Position : " << position_length_vector[i].first << " length : " << position_length_vector[i].second
                << std::endl;
  }

  return result;
}